

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O3

int SUNMemoryHelper_Destroy(SUNMemoryHelper helper)

{
  _func_int_SUNMemoryHelper *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = helper->ops->destroy;
  if (UNRECOVERED_JUMPTABLE != (_func_int_SUNMemoryHelper *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(helper);
    return iVar1;
  }
  iVar1 = -1;
  if (helper->content == (void *)0x0) {
    free(helper->ops);
    free(helper);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int SUNMemoryHelper_Destroy(SUNMemoryHelper helper)
{
  if (helper->ops->destroy == NULL)
  {
    if (helper->content != NULL)
    {
      return(-1);
    }
    else
    {
      free(helper->ops);
      free(helper);
    }
  }
  else
  {
    return(helper->ops->destroy(helper));
  }
  return(0);
}